

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void init_me_luts(void)

{
  int i;
  long lVar1;
  int *piVar2;
  double dVar3;
  
  piVar2 = sad_per_bit_lut_8;
  lVar1 = 0;
  do {
    dVar3 = av1_convert_qindex_to_q((int)lVar1,AOM_BITS_8);
    *piVar2 = (int)(dVar3 * 0.0418 + 2.4107);
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 1;
  } while (lVar1 != 0x100);
  piVar2 = sad_per_bit_lut_10;
  lVar1 = 0;
  do {
    dVar3 = av1_convert_qindex_to_q((int)lVar1,AOM_BITS_10);
    *piVar2 = (int)(dVar3 * 0.0418 + 2.4107);
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 1;
  } while (lVar1 != 0x100);
  piVar2 = sad_per_bit_lut_12;
  lVar1 = 0;
  do {
    dVar3 = av1_convert_qindex_to_q((int)lVar1,AOM_BITS_12);
    *piVar2 = (int)(dVar3 * 0.0418 + 2.4107);
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

static void init_me_luts(void) {
  init_me_luts_bd(sad_per_bit_lut_8, QINDEX_RANGE, AOM_BITS_8);
  init_me_luts_bd(sad_per_bit_lut_10, QINDEX_RANGE, AOM_BITS_10);
  init_me_luts_bd(sad_per_bit_lut_12, QINDEX_RANGE, AOM_BITS_12);
}